

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

CurveGeometry * embree::sse2::createCurves(Device *device,GType gtype)

{
  CurveGeometry *this;
  undefined8 *puVar1;
  allocator local_39;
  string local_38 [32];
  
  switch(gtype) {
  case GTY_BASIS_BEZIER:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
                        *)this,device,GTY_BASIS_BEZIER);
    break;
  case GTY_ROUND_BEZIER_CURVE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
                        *)this,device,GTY_ROUND_BEZIER_CURVE);
    break;
  case GTY_ORIENTED_BEZIER_CURVE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
                        *)this,device,GTY_ORIENTED_BEZIER_CURVE);
    break;
  default:
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_38,"invalid geometry type",&local_39);
    *puVar1 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar1 + 1) = 3;
    std::__cxx11::string::string((string *)(puVar1 + 2),local_38);
    __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  case GTY_BASIS_BSPLINE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
                        *)this,device,GTY_BASIS_BSPLINE);
    break;
  case GTY_ROUND_BSPLINE_CURVE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
                        *)this,device,GTY_ROUND_BSPLINE_CURVE);
    break;
  case GTY_ORIENTED_BSPLINE_CURVE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BSplineCurveT>
                        *)this,device,GTY_ORIENTED_BSPLINE_CURVE);
    break;
  case GTY_BASIS_HERMITE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
                        *)this,device,GTY_BASIS_HERMITE);
    break;
  case GTY_ROUND_HERMITE_CURVE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
                        *)this,device,GTY_ROUND_HERMITE_CURVE);
    break;
  case GTY_ORIENTED_HERMITE_CURVE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
                        *)this,device,GTY_ORIENTED_HERMITE_CURVE);
    break;
  case GTY_BASIS_CATMULL_ROM:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
                        *)this,device,GTY_BASIS_CATMULL_ROM);
    break;
  case GTY_ROUND_CATMULL_ROM_CURVE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)1,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
                        *)this,device,GTY_ROUND_CATMULL_ROM_CURVE);
    break;
  case GTY_ORIENTED_CATMULL_ROM_CURVE:
    this = (CurveGeometry *)::operator_new(0x250);
    CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
    ::CurveGeometryISA((CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
                        *)this,device,GTY_ORIENTED_CATMULL_ROM_CURVE);
  }
  return this;
}

Assistant:

CurveGeometry* createCurves(Device* device, Geometry::GType gtype)
    {
      switch (gtype) {
      case Geometry::GTY_ROUND_BEZIER_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,CurveGeometryInterface,BezierCurveT>(device,gtype);
      case Geometry::GTY_FLAT_BEZIER_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,CurveGeometryInterface,BezierCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_BEZIER_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,CurveGeometryInterface,BezierCurveT>(device,gtype);
        
      case Geometry::GTY_ROUND_BSPLINE_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,CurveGeometryInterface,BSplineCurveT>(device,gtype);
      case Geometry::GTY_FLAT_BSPLINE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,CurveGeometryInterface,BSplineCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_BSPLINE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,CurveGeometryInterface,BSplineCurveT>(device,gtype);

      case Geometry::GTY_ROUND_HERMITE_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,HermiteCurveGeometryInterface,HermiteCurveT>(device,gtype);
      case Geometry::GTY_FLAT_HERMITE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,HermiteCurveGeometryInterface,HermiteCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_HERMITE_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,HermiteCurveGeometryInterface,HermiteCurveT>(device,gtype);

      case Geometry::GTY_ROUND_CATMULL_ROM_CURVE: return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ROUND_CURVE,CurveGeometryInterface,CatmullRomCurveT>(device,gtype);
      case Geometry::GTY_FLAT_CATMULL_ROM_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_FLAT_CURVE,CurveGeometryInterface,CatmullRomCurveT>(device,gtype);
      case Geometry::GTY_ORIENTED_CATMULL_ROM_CURVE : return new CurveGeometryISA<Geometry::GTY_SUBTYPE_ORIENTED_CURVE,CurveGeometryInterface,CatmullRomCurveT>(device,gtype);
     
      default: throw_RTCError(RTC_ERROR_INVALID_OPERATION,"invalid geometry type");
      }
    }